

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void C_RemoveTabCommand(char *name)

{
  TabData *pTVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = FName::NameManager::FindName(&FName::NameData,name,true);
  if (iVar2 != 0) {
    for (uVar3 = 0; TabCommands.Count != uVar3; uVar3 = uVar3 + 1) {
      if (TabCommands.Array[uVar3].TabName.Index == iVar2) {
        pTVar1 = TabCommands.Array + uVar3;
        pTVar1->UseCount = pTVar1->UseCount + -1;
        if (pTVar1->UseCount != 0) {
          return;
        }
        TArray<TabData,_TabData>::Delete(&TabCommands,(uint)uVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

void C_RemoveTabCommand (const char *name)
{
	FName aname(name, true);

	if (aname == NAME_None)
	{
		return;
	}
	for (unsigned int i = 0; i < TabCommands.Size(); ++i)
	{
		if (TabCommands[i].TabName == aname)
		{
			if (--TabCommands[i].UseCount == 0)
			{
				TabCommands.Delete(i);
			}
			break;
		}
	}
}